

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void start_scope(LinearizerState *linearizer,Proc *proc,Scope *scope)

{
  ravitype_t type;
  uint uVar1;
  Proc *sym;
  Scope *pSVar2;
  PtrListIterator symiter__;
  
  (linearizer->C_declarations).pos = (size_t)proc;
  raviX_ptrlist_forward_iterator(&symiter__,*(PtrList **)&proc->id);
  sym = (Proc *)raviX_ptrlist_iter_next(&symiter__);
  while (sym != (Proc *)0x0) {
    if (sym->node_count == 0) {
      if ((((ulong)sym->function_expr & 3) == 0) &&
         ((type = *(ravitype_t *)&sym->nodes, type == RAVI_TNUMFLT || (type == RAVI_TNUMINT)))) {
        pSVar2 = (Scope *)allocate_temp_pseudo((Proc *)linearizer,type,true);
        sym->current_scope = pSVar2;
        ((anon_union_40_9_1ec7a544_for_Pseudo_3 *)&pSVar2->parent)->proc = sym;
      }
      else {
        uVar1 = allocate_register((PseudoGenerator *)&linearizer[1].current_proc,true);
        allocate_symbol_pseudo((Proc *)linearizer,(LuaSymbol *)sym,uVar1 & 0xff);
      }
    }
    sym = (Proc *)raviX_ptrlist_iter_next(&symiter__);
  }
  return;
}

Assistant:

static void start_scope(LinearizerState *linearizer, Proc *proc, Scope *scope)
{
	proc->current_scope = scope;
	LuaSymbol *sym;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			uint8_t reg;
			if (!sym->variable.escaped && !sym->variable.function_parameter &&
			    (sym->variable.value_type.type_code == RAVI_TNUMFLT ||
			     sym->variable.value_type.type_code == RAVI_TNUMINT)) {
				Pseudo *pseudo;
				if (sym->variable.value_type.type_code == RAVI_TNUMFLT)
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMFLT, true);
				else
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMINT, true);
				sym->variable.pseudo = pseudo;
				pseudo->temp_for_local = sym; /* Note that this temp is for a local */
			}
			else {
				reg = allocate_register(&proc->local_pseudos, true);
				allocate_symbol_pseudo(proc, sym, reg);
			}
		}
	}
	END_FOR_EACH_PTR(sym)
}